

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dbp_encoder.hpp
# Opt level: O0

void __thiscall
duckdb::DbpEncoder::BeginWriteInternal(DbpEncoder *this,WriteStream *writer,int64_t *first_value)

{
  long lVar1;
  long *in_RDX;
  long *in_RDI;
  WriteStream *in_stack_ffffffffffffffd8;
  
  ParquetDecodeUtils::VarintEncode<unsigned_long>((unsigned_long)in_RDI,in_stack_ffffffffffffffd8);
  ParquetDecodeUtils::VarintEncode<unsigned_long>((unsigned_long)in_RDI,in_stack_ffffffffffffffd8);
  ParquetDecodeUtils::VarintEncode<unsigned_long>((unsigned_long)in_RDI,in_stack_ffffffffffffffd8);
  ParquetDecodeUtils::IntToZigzag<long>((long)in_RDI);
  ParquetDecodeUtils::VarintEncode<unsigned_long>((unsigned_long)in_RDI,in_stack_ffffffffffffffd8);
  if (*in_RDI != 0) {
    in_RDI[1] = in_RDI[1] + 1;
  }
  in_RDI[2] = *in_RDX;
  lVar1 = NumericLimits<long>::Maximum();
  in_RDI[3] = lVar1;
  in_RDI[0x804] = 0;
  return;
}

Assistant:

void BeginWriteInternal(WriteStream &writer, const int64_t &first_value) {
		// <block size in values> <number of miniblocks in a block> <total value count> <first value>

		// the block size is a multiple of 128; it is stored as a ULEB128 int
		ParquetDecodeUtils::VarintEncode(BLOCK_SIZE_IN_VALUES, writer);
		// the miniblock count per block is a divisor of the block size such that their quotient,
		// the number of values in a miniblock, is a multiple of 32
		static_assert(BLOCK_SIZE_IN_VALUES % NUMBER_OF_MINIBLOCKS_IN_A_BLOCK == 0 &&
		                  NUMBER_OF_VALUES_IN_A_MINIBLOCK % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE == 0,
		              "invalid block sizes for DELTA_BINARY_PACKED");
		// it is stored as a ULEB128 int
		ParquetDecodeUtils::VarintEncode(NUMBER_OF_MINIBLOCKS_IN_A_BLOCK, writer);
		// the total value count is stored as a ULEB128 int
		ParquetDecodeUtils::VarintEncode(total_value_count, writer);
		// the first value is stored as a zigzag ULEB128 int
		ParquetDecodeUtils::VarintEncode(ParquetDecodeUtils::IntToZigzag(first_value), writer);

		// initialize
		if (total_value_count != 0) {
			count++;
		}
		previous_value = first_value;

		min_delta = NumericLimits<int64_t>::Maximum();
		block_count = 0;
	}